

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

void cp_decl_attributes(CPState *cp,CPDecl *decl)

{
  GCstr *pGVar1;
  TValue *pTVar2;
  uint uVar3;
  CTSize CVar4;
  CPToken CVar5;
  int iVar6;
  uint uVar7;
  char cVar8;
  int iVar9;
  GCstr *pGVar10;
  bool bVar11;
  
LAB_0014ad77:
  switch(cp->tok) {
  case 0x118:
    uVar3 = decl->attr;
    uVar7 = 0x2000000;
    break;
  case 0x119:
    uVar3 = decl->attr;
    uVar7 = 0x1000000;
    break;
  case 0x11a:
  case 0x121:
  case 0x125:
    goto switchD_0014ad93_caseD_11a;
  default:
    goto switchD_0014ad93_caseD_11b;
  case 0x122:
    cp_next(cp);
    cp_check(cp,0x28);
    if (cp->tok == 0x101) {
      pGVar10 = cp->str;
      while (CVar5 = cp_next(cp), CVar5 == 0x101) {
        lj_strfmt_pushf(cp->L,"%s%s",pGVar10 + 1,cp->str + 1);
        pTVar2 = cp->L->top;
        cp->L->top = pTVar2 + -1;
        pGVar10 = (GCstr *)(pTVar2[-1].u64 & 0x7fffffffffff);
      }
      decl->redir = pGVar10;
    }
    goto LAB_0014b0ed;
  case 0x123:
    cp_next(cp);
    cp_check(cp,0x28);
    cp_check(cp,0x28);
    do {
      iVar6 = cp->tok;
      if (iVar6 == 0x100) {
        pGVar10 = cp->str;
        cp_next(cp);
        iVar6 = lj_cparse_case(pGVar10,
                               "\aaligned\v__aligned__\x06packed\n__packed__\x04mode\b__mode__\vvector_size\x0f__vector_size__"
                              );
        switch(iVar6) {
        case 0:
        case 1:
          cp_decl_align(cp,decl);
          break;
        case 2:
        case 3:
          *(byte *)&decl->attr = (byte)decl->attr | 2;
          break;
        case 4:
        case 5:
          cp_check(cp,0x28);
          if (cp->tok != 0x100) goto LAB_0014afba;
          pGVar1 = cp->str;
          pGVar10 = pGVar1 + 1;
          cVar8 = (char)pGVar1[1].nextgc.gcptr64;
          if (cVar8 == '_') {
            bVar11 = *(char *)((long)&pGVar1[1].nextgc.gcptr64 + 1) == '_';
            if (bVar11) {
              pGVar10 = (GCstr *)((long)&pGVar1[1].nextgc.gcptr64 + 2);
            }
            cVar8 = *(char *)((long)&pGVar1[1].nextgc.gcptr64 + (ulong)bVar11 * 2);
          }
          iVar6 = 0;
          if (cVar8 == 'V') {
            iVar6 = *(char *)((long)&(pGVar10->nextgc).gcptr64 + 1) + -0x30;
            cVar8 = *(char *)((long)&(pGVar10->nextgc).gcptr64 + 2);
            if ((byte)(cVar8 - 0x30U) < 10) {
              iVar6 = (uint)(byte)(cVar8 - 0x30U) + iVar6 * 10;
              cVar8 = *(char *)((long)&(pGVar10->nextgc).gcptr64 + 3);
              pGVar10 = (GCstr *)((long)&(pGVar10->nextgc).gcptr64 + 3);
            }
            else {
              pGVar10 = (GCstr *)((long)&(pGVar10->nextgc).gcptr64 + 2);
            }
          }
          iVar9 = 1;
          switch(cVar8) {
          case 'O':
            iVar9 = 0x20;
            break;
          case 'P':
          case 'R':
            goto switchD_0014af4f_caseD_50;
          case 'Q':
            break;
          case 'S':
            iVar9 = 4;
            break;
          case 'T':
            iVar9 = 0x10;
            break;
          default:
            if (cVar8 == 'D') {
              iVar9 = 8;
            }
            else {
              if (cVar8 != 'H') goto switchD_0014af4f_caseD_50;
              iVar9 = 2;
            }
          }
          cVar8 = *(char *)((long)&(pGVar10->nextgc).gcptr64 + 1);
          if ((cVar8 == 'I') || (cVar8 == 'F')) {
            uVar3 = decl->attr;
            decl->attr = iVar9 << 8 | uVar3 & 0xffff00ff;
            if (iVar6 != 0) {
              uVar7 = 0x1f;
              if (iVar9 * iVar6 != 0) {
                for (; (uint)(iVar9 * iVar6) >> uVar7 == 0; uVar7 = uVar7 - 1) {
                }
              }
              decl->attr = ((~uVar7 & 0xf) << 4 | iVar9 << 8 | uVar3 & 0xffff000f) ^ 0xf0;
            }
          }
switchD_0014af4f_caseD_50:
          cp_next(cp);
          goto LAB_0014afba;
        case 6:
        case 7:
          CVar4 = cp_decl_sizeattr(cp);
          if (CVar4 != 0) {
            uVar3 = 0x1f;
            if (CVar4 != 0) {
              for (; CVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
              }
            }
            decl->attr = ((~uVar3 & 0xf) << 4 | decl->attr & 0xffffff0f) ^ 0xf0;
          }
          break;
        default:
          goto switchD_0014ae76_default;
        }
      }
      else {
        if ((iVar6 == 0x29) || (iVar6 < 0x10d)) break;
        cp_next(cp);
switchD_0014ae76_default:
        iVar6 = cp_opt(cp,0x28);
        if (iVar6 == 0) goto LAB_0014afc5;
        while ((cp->tok != 0x29 && (cp->tok != 0x103))) {
          cp_next(cp);
        }
LAB_0014afba:
        cp_check(cp,0x29);
      }
LAB_0014afc5:
      iVar6 = cp_opt(cp,0x2c);
    } while (iVar6 != 0);
    cp_check(cp,0x29);
LAB_0014b0ed:
    cp_check(cp,0x29);
    goto LAB_0014ad77;
  case 0x124:
    cp_next(cp);
    CVar5 = 0x28;
    do {
      cp_check(cp,CVar5);
      do {
        while( true ) {
          if (cp->tok != 0x100) goto LAB_0014b0ed;
          pGVar10 = cp->str;
          cp_next(cp);
          if ((pGVar10->len != 5) || (iVar6 = bcmp(pGVar10 + 1,"align",5), iVar6 != 0)) break;
          cp_decl_align(cp,decl);
        }
        iVar6 = cp_opt(cp,0x28);
      } while (iVar6 == 0);
      while ((CVar5 = 0x29, cp->tok != 0x29 && (cp->tok != 0x103))) {
        cp_next(cp);
      }
    } while( true );
  case 0x126:
    uVar7 = decl->attr & 0xffff00ff;
    uVar3 = (cp->ct->size & 0xff) << 8;
  }
  decl->attr = uVar3 | uVar7;
switchD_0014ad93_caseD_11a:
  cp_next(cp);
  goto LAB_0014ad77;
switchD_0014ad93_caseD_11b:
  return;
}

Assistant:

static void cp_decl_attributes(CPState *cp, CPDecl *decl)
{
  for (;;) {
    switch (cp->tok) {
    case CTOK_CONST: decl->attr |= CTF_CONST; break;
    case CTOK_VOLATILE: decl->attr |= CTF_VOLATILE; break;
    case CTOK_RESTRICT: break;  /* Ignore. */
    case CTOK_EXTENSION: break;  /* Ignore. */
    case CTOK_ATTRIBUTE: cp_decl_gccattribute(cp, decl); continue;
    case CTOK_ASM: cp_decl_asm(cp, decl); continue;
    case CTOK_DECLSPEC: cp_decl_msvcattribute(cp, decl); continue;
    case CTOK_CCDECL:
#if LJ_TARGET_X86
      CTF_INSERT(decl->fattr, CCONV, cp->ct->size);
      decl->fattr |= CTFP_CCONV;
#endif
      break;
    case CTOK_PTRSZ:
#if LJ_64
      CTF_INSERT(decl->attr, MSIZEP, cp->ct->size);
#endif
      break;
    default: return;
    }
    cp_next(cp);
  }
}